

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

int t2_decode_packets(opj_t2_t *t2,uchar *src,int len,int tileno,opj_tcd_tile_t *tile,
                     opj_codestream_info_t *cstr_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  opj_image_t *image;
  opj_cp_t *cp;
  opj_tcp_t *poVar7;
  opj_cp_t *poVar8;
  opj_tcd_resolution_t *poVar9;
  opj_tcd_precinct_t *poVar10;
  opj_tcd_cblk_enc_t *poVar11;
  opj_tcd_seg_t *poVar12;
  opj_tile_info_t *poVar13;
  opj_tp_info_t *poVar14;
  int iVar15;
  opj_bool oVar16;
  uint uVar17;
  int iVar18;
  OPJ_UINT32 OVar19;
  int iVar20;
  opj_pi_iterator_t *pi;
  opj_bio_t *bio;
  ulong uVar21;
  uchar **ppuVar22;
  uchar *puVar23;
  opj_image_comp_t *poVar24;
  long lVar25;
  opj_packet_info_t *poVar26;
  long lVar27;
  opj_tcd_cblk_dec_t *cblk;
  opj_tcd_layer_t *poVar28;
  OPJ_FLOAT64 *pOVar29;
  int iVar30;
  int iVar31;
  opj_pi_iterator_t *pi_00;
  long lVar32;
  long lVar33;
  int i;
  int index;
  uchar *local_118;
  int local_110;
  int local_10c;
  int local_f0;
  uchar *local_e8;
  opj_packet_info_t *local_e0;
  
  image = t2->image;
  cp = t2->cp;
  pi = pi_create_decode(image,cp,tileno);
  local_f0 = -999;
  if (pi != (opj_pi_iterator_t *)0x0) {
    local_10c = 0;
    local_110 = 0;
    local_118 = src;
    for (lVar27 = 0; lVar27 <= cp->tcps[tileno].numpocs; lVar27 = lVar27 + 1) {
      pi_00 = pi + lVar27;
      while (oVar16 = pi_next(pi_00), oVar16 != 0) {
        if ((cp->layer == 0) || (iVar31 = 0, pi_00->layno < cp->layer)) {
          if (cstr_info == (opj_codestream_info_t *)0x0) {
            local_e0 = (opj_packet_info_t *)0x0;
          }
          else {
            local_e0 = cstr_info->tile[tileno].packet + cstr_info->packno;
          }
          poVar7 = cp->tcps;
          poVar8 = t2->cp;
          iVar20 = pi_00->compno;
          iVar1 = pi_00->resno;
          iVar2 = pi_00->precno;
          iVar3 = pi_00->layno;
          poVar9 = tile->comps[iVar20].resolutions;
          if (iVar3 == 0) {
            for (lVar25 = 0; lVar25 < poVar9[iVar1].numbands; lVar25 = lVar25 + 1) {
              if ((poVar9[iVar1].bands[lVar25].x1 != poVar9[iVar1].bands[lVar25].x0) &&
                 (poVar9[iVar1].bands[lVar25].y1 != poVar9[iVar1].bands[lVar25].y0)) {
                poVar10 = poVar9[iVar1].bands[lVar25].precincts;
                tgt_reset(poVar10[iVar2].incltree);
                tgt_reset(poVar10[iVar2].imsbtree);
                uVar17 = poVar10[iVar2].ch * poVar10[iVar2].cw;
                uVar21 = (ulong)uVar17;
                if ((int)uVar17 < 1) {
                  uVar21 = 0;
                }
                for (lVar32 = 0; uVar21 * 0x38 - lVar32 != 0; lVar32 = lVar32 + 0x38) {
                  *(undefined4 *)((long)&(poVar10[iVar2].cblks.enc)->numpasses + lVar32) = 0;
                }
              }
            }
          }
          puVar23 = local_118;
          if ((poVar7[tileno].csty & 2) != 0) {
            if ((*local_118 == 0xff) && (local_118[1] == 0x91)) {
              puVar23 = local_118 + 6;
            }
            else {
              opj_event_msg(t2->cinfo,2,"Expected SOP marker\n");
            }
          }
          iVar31 = (int)local_118;
          iVar15 = (len + (int)src) - iVar31;
          bio = bio_create();
          if (poVar8->ppm == 1) {
            local_e8 = poVar8->ppm_data;
            iVar18 = poVar8->ppm_len;
LAB_00136fbc:
            bio_init_dec(bio,local_e8,iVar18);
          }
          else {
            if (poVar7[tileno].ppt == 1) {
              local_e8 = poVar7[tileno].ppt_data;
              iVar18 = poVar7[tileno].ppt_len;
              goto LAB_00136fbc;
            }
            bio_init_dec(bio,puVar23,(iVar31 + iVar15) - (int)puVar23);
            local_e8 = puVar23;
          }
          iVar18 = bio_read(bio,1);
          if (iVar18 == 0) {
            bio_inalign(bio);
            iVar20 = bio_numbytes(bio);
            local_e8 = local_e8 + iVar20;
            bio_destroy(bio);
            if ((poVar7[tileno].csty & 4) != 0) {
              if ((*local_e8 == 0xff) && (local_e8[1] == 0x92)) {
                local_e8 = local_e8 + 2;
              }
              else {
                puts("Error : expected EPH marker");
              }
            }
            if (local_e0 != (opj_packet_info_t *)0x0) {
              local_e0->end_ph_pos = (long)((int)puVar23 - iVar31);
            }
            if (poVar8->ppm == 1) {
              ppuVar22 = &poVar8->ppm_data;
              poVar8->ppm_len = poVar8->ppm_len + (*(int *)&poVar8->ppm_data - (int)local_e8);
LAB_00137476:
              *ppuVar22 = local_e8;
              local_e8 = puVar23;
            }
            else if (poVar7[tileno].ppt == 1) {
              ppuVar22 = &poVar7[tileno].ppt_data;
              poVar7[tileno].ppt_len =
                   poVar7[tileno].ppt_len + (*(int *)&poVar7[tileno].ppt_data - (int)local_e8);
              goto LAB_00137476;
            }
          }
          else {
            for (lVar25 = 0; lVar25 < poVar9[iVar1].numbands; lVar25 = lVar25 + 1) {
              if ((poVar9[iVar1].bands[lVar25].x1 != poVar9[iVar1].bands[lVar25].x0) &&
                 (poVar9[iVar1].bands[lVar25].y1 != poVar9[iVar1].bands[lVar25].y0)) {
                poVar10 = poVar9[iVar1].bands[lVar25].precincts;
                for (lVar32 = 0; lVar32 < (long)poVar10[iVar2].ch * (long)poVar10[iVar2].cw;
                    lVar32 = lVar32 + 1) {
                  poVar11 = poVar10[iVar2].cblks.enc;
                  if ((&poVar11->numpasses)[lVar32 * 0xe] == 0) {
                    OVar19 = tgt_decode(bio,poVar10[iVar2].incltree,(OPJ_UINT32)lVar32,iVar3 + 1);
                  }
                  else {
                    OVar19 = bio_read(bio,1);
                  }
                  cblk = (opj_tcd_cblk_dec_t *)(&poVar11->data + lVar32 * 7);
                  if (OVar19 == 0) {
                    cblk->numnewpasses = 0;
                  }
                  else {
                    if (cblk->numsegs == 0) {
                      iVar18 = 0;
                      do {
                        OVar19 = tgt_decode(bio,poVar10[iVar2].imsbtree,(OPJ_UINT32)lVar32,iVar18);
                        iVar18 = iVar18 + 1;
                      } while (OVar19 == 0);
                      cblk->numbps = (poVar9[iVar1].bands[lVar25].numbps - iVar18) + 2;
                      cblk->numlenbits = 3;
                    }
                    iVar18 = t2_getnumpasses(bio);
                    cblk->numnewpasses = iVar18;
                    iVar18 = t2_getcommacode(bio);
                    cblk->numlenbits = cblk->numlenbits + iVar18;
                    uVar17 = cblk->numsegs;
                    if ((long)(int)uVar17 == 0) {
                      uVar21 = 0;
                      t2_init_seg(cblk,0,poVar7[tileno].tccps[iVar20].cblksty,1);
                    }
                    else {
                      uVar21 = (long)(int)uVar17 - 1;
                      if (cblk->segs[uVar21].numpasses == cblk->segs[uVar21].maxpasses) {
                        t2_init_seg(cblk,uVar17,poVar7[tileno].tccps[iVar20].cblksty,0);
                        uVar21 = (ulong)uVar17;
                      }
                    }
                    iVar18 = cblk->numnewpasses;
                    index = (int)uVar21;
                    lVar33 = (long)index * 0x28;
                    while( true ) {
                      index = index + 1;
                      poVar12 = cblk->segs;
                      iVar30 = *(int *)((long)&poVar12->maxpasses + lVar33) -
                               *(int *)((long)&poVar12->numpasses + lVar33);
                      if (iVar18 <= iVar30) {
                        iVar30 = iVar18;
                      }
                      *(int *)((long)&poVar12->numnewpasses + lVar33) = iVar30;
                      iVar4 = cblk->numlenbits;
                      iVar30 = int_floorlog2(iVar30);
                      iVar30 = bio_read(bio,iVar4 + iVar30);
                      poVar12 = cblk->segs;
                      *(int *)((long)&poVar12->newlen + lVar33) = iVar30;
                      iVar18 = iVar18 - *(int *)((long)&poVar12->numnewpasses + lVar33);
                      if (iVar18 < 1) break;
                      t2_init_seg(cblk,index,poVar7[tileno].tccps[iVar20].cblksty,0);
                      lVar33 = lVar33 + 0x28;
                    }
                  }
                }
              }
            }
            iVar20 = bio_inalign(bio);
            if (iVar20 != 0) {
              bio_destroy(bio);
              return -999;
            }
            iVar20 = bio_numbytes(bio);
            local_e8 = local_e8 + iVar20;
            bio_destroy(bio);
            if ((poVar7[tileno].csty & 4) != 0) {
              if ((*local_e8 != 0xff) || (local_e8[1] != 0x92)) {
                opj_event_msg(t2->cinfo,1,"Expected EPH marker\n");
                return -999;
              }
              local_e8 = local_e8 + 2;
            }
            iVar20 = (int)local_e8;
            if (local_e0 != (opj_packet_info_t *)0x0) {
              local_e0->end_ph_pos = (long)(iVar20 - iVar31);
            }
            if (poVar8->ppm == 1) {
              ppuVar22 = &poVar8->ppm_data;
              poVar8->ppm_len = poVar8->ppm_len + (*(int *)&poVar8->ppm_data - iVar20);
LAB_001373df:
              *ppuVar22 = local_e8;
              local_e8 = puVar23;
            }
            else if (poVar7[tileno].ppt == 1) {
              ppuVar22 = &poVar7[tileno].ppt_data;
              poVar7[tileno].ppt_len =
                   poVar7[tileno].ppt_len + (*(int *)&poVar7[tileno].ppt_data - iVar20);
              goto LAB_001373df;
            }
            for (lVar25 = 0; lVar25 < poVar9[iVar1].numbands; lVar25 = lVar25 + 1) {
              if ((poVar9[iVar1].bands[lVar25].x1 != poVar9[iVar1].bands[lVar25].x0) &&
                 (poVar9[iVar1].bands[lVar25].y1 != poVar9[iVar1].bands[lVar25].y0)) {
                poVar10 = poVar9[iVar1].bands[lVar25].precincts;
                for (lVar32 = 0; lVar32 < (long)poVar10[iVar2].ch * (long)poVar10[iVar2].cw;
                    lVar32 = lVar32 + 1) {
                  if ((&(poVar10[iVar2].cblks.enc)->numlenbits)[lVar32 * 0xe] != 0) {
                    ppuVar22 = &(poVar10[iVar2].cblks.enc)->data + lVar32 * 7;
                    iVar20 = *(int *)(ppuVar22 + 6);
                    poVar28 = (opj_tcd_layer_t *)ppuVar22[1];
                    if ((long)iVar20 == 0) {
                      *(int *)(ppuVar22 + 6) = 1;
                      *(int *)(ppuVar22 + 5) = 0;
                    }
                    else {
                      lVar33 = (long)iVar20 * 0x28;
                      if (*(int *)((long)poVar28 + lVar33 + -0x1c) ==
                          *(int *)((long)poVar28 + lVar33 + -0x10)) {
                        poVar28 = (opj_tcd_layer_t *)((long)poVar28 + lVar33);
                        *(int *)(ppuVar22 + 6) = iVar20 + 1;
                      }
                      else {
                        poVar28 = (opj_tcd_layer_t *)((long)poVar28 + lVar33 + -0x28);
                      }
                    }
                    pOVar29 = &poVar28[1].disto;
                    while( true ) {
                      if (local_118 + iVar15 < local_e8 + *(uint *)pOVar29) {
                        return -999;
                      }
                      puVar23 = (uchar *)realloc(*ppuVar22,
                                                 (ulong)(*(uint *)pOVar29 + *(int *)(ppuVar22 + 5)))
                      ;
                      *ppuVar22 = puVar23;
                      memcpy(puVar23 + *(int *)(ppuVar22 + 5),local_e8,(ulong)*(uint *)pOVar29);
                      uVar17 = *(uint *)((long)pOVar29 + -0x14);
                      uVar5 = *(uint *)(ppuVar22 + 5);
                      if (uVar17 == 0) {
                        pOVar29[-4] = (OPJ_FLOAT64)ppuVar22;
                        *(uint *)(pOVar29 + -3) = uVar5;
                      }
                      uVar6 = *(uint *)pOVar29;
                      *(uint *)(ppuVar22 + 5) = uVar5 + uVar6;
                      *(uint *)((long)pOVar29 + -0xc) = *(uint *)((long)pOVar29 + -0xc) + uVar6;
                      local_e8 = local_e8 + uVar6;
                      *(uint *)((long)pOVar29 + -0x14) =
                           uVar17 + *(OPJ_UINT32 *)((long)pOVar29 + -4);
                      iVar20 = *(int *)((long)ppuVar22 + 0x2c) - *(OPJ_UINT32 *)((long)pOVar29 + -4)
                      ;
                      *(int *)((long)ppuVar22 + 0x2c) = iVar20;
                      if (iVar20 < 1) break;
                      *(int *)(ppuVar22 + 6) = *(int *)(ppuVar22 + 6) + 1;
                      pOVar29 = pOVar29 + 5;
                    }
                  }
                }
              }
            }
          }
          iVar31 = (int)local_e8 - iVar31;
          if (iVar31 == -999) {
            return -999;
          }
          if (iVar31 < 1) goto LAB_00137619;
          poVar24 = image->comps;
          lVar25 = (long)pi_00->compno;
          OVar19 = poVar24[lVar25].resno_decoded;
          if ((int)poVar24[lVar25].resno_decoded < pi_00->resno) {
            OVar19 = pi_00->resno;
          }
        }
        else {
LAB_00137619:
          poVar24 = image->comps;
          lVar25 = (long)pi_00->compno;
          OVar19 = poVar24[lVar25].resno_decoded;
        }
        poVar24[lVar25].resno_decoded = OVar19;
        if (cstr_info != (opj_codestream_info_t *)0x0) {
          poVar13 = cstr_info->tile;
          iVar20 = cstr_info->packno;
          poVar26 = poVar13[tileno].packet + iVar20;
          if ((long)iVar20 == 0) {
            lVar25 = (long)poVar13[tileno].end_header + 1;
          }
          else {
            poVar14 = poVar13[tileno].tp;
            lVar25 = (long)local_10c;
            if (poVar26[-1].end_pos < (long)poVar14[lVar25].tp_end_pos) {
              if ((cp->tp_on == '\0') || (lVar25 = poVar26->start_pos, lVar25 == 0)) {
                lVar25 = poVar26[-1].end_pos + 1;
              }
            }
            else {
              poVar14[lVar25].tp_numpacks = iVar20 - local_110;
              poVar14[lVar25].tp_start_pack = local_110;
              local_10c = local_10c + 1;
              lVar25 = (long)poVar14[local_10c].tp_end_header + 1;
              local_110 = iVar20;
            }
          }
          poVar26->start_pos = lVar25;
          poVar26->end_pos = lVar25 + iVar31 + -1;
          poVar26->end_ph_pos = poVar26->end_ph_pos + lVar25 + -1;
          cstr_info->packno = iVar20 + 1;
        }
        local_118 = local_118 + iVar31;
      }
    }
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      poVar14 = cstr_info->tile[tileno].tp;
      poVar14[local_10c].tp_numpacks = cstr_info->packno - local_110;
      poVar14[local_10c].tp_start_pack = local_110;
    }
    pi_destroy(pi,cp,tileno);
    local_f0 = (int)local_118 - (int)src;
  }
  return local_f0;
}

Assistant:

int t2_decode_packets(opj_t2_t *t2, unsigned char *src, int len, int tileno, opj_tcd_tile_t *tile, opj_codestream_info_t *cstr_info) {
	unsigned char *c = src;
	opj_pi_iterator_t *pi;
	int pino, e = 0;
	int n = 0, curtp = 0;
	int tp_start_packno;

	opj_image_t *image = t2->image;
	opj_cp_t *cp = t2->cp;
	
	/* create a packet iterator */
	pi = pi_create_decode(image, cp, tileno);
	if(!pi) {
		/* TODO: throw an error */
		return -999;
	}

	tp_start_packno = 0;
	
	for (pino = 0; pino <= cp->tcps[tileno].numpocs; pino++) {
		while (pi_next(&pi[pino])) {
			if ((cp->layer==0) || (cp->layer>=((pi[pino].layno)+1))) {
				opj_packet_info_t *pack_info;
				if (cstr_info)
					pack_info = &cstr_info->tile[tileno].packet[cstr_info->packno];
				else
					pack_info = NULL;
				e = t2_decode_packet(t2, c, src + len - c, tile, &cp->tcps[tileno], &pi[pino], pack_info);
			} else {
				e = 0;
			}
			if(e == -999) return -999;
			/* progression in resolution */
			image->comps[pi[pino].compno].resno_decoded =	
				(e > 0) ? 
				int_max(pi[pino].resno, image->comps[pi[pino].compno].resno_decoded) 
				: image->comps[pi[pino].compno].resno_decoded;
			n++;

			/* INDEX >> */
			if(cstr_info) {
				opj_tile_info_t *info_TL = &cstr_info->tile[tileno];
				opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
				if (!cstr_info->packno) {
					info_PK->start_pos = info_TL->end_header + 1;
				} else if (info_TL->packet[cstr_info->packno-1].end_pos >= (int)cstr_info->tile[tileno].tp[curtp].tp_end_pos){ /* New tile part*/
					info_TL->tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in previous tile-part*/
          info_TL->tp[curtp].tp_start_pack = tp_start_packno;
					tp_start_packno = cstr_info->packno;
					curtp++;
					info_PK->start_pos = cstr_info->tile[tileno].tp[curtp].tp_end_header+1;
				} else {
					info_PK->start_pos = (cp->tp_on && info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno - 1].end_pos + 1;
				}
				info_PK->end_pos = info_PK->start_pos + e - 1;
				info_PK->end_ph_pos += info_PK->start_pos - 1;	/* End of packet header which now only represents the distance 
																												// to start of packet is incremented by value of start of packet*/
				cstr_info->packno++;
			}
			/* << INDEX */
			
			if (e == -999) {		/* ADD */
				break;
			} else {
				c += e;
			}			
		}
	}
	/* INDEX >> */
	if(cstr_info) {
		cstr_info->tile[tileno].tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in last tile-part*/
    cstr_info->tile[tileno].tp[curtp].tp_start_pack = tp_start_packno;
	}
	/* << INDEX */

	/* don't forget to release pi */
	pi_destroy(pi, cp, tileno);
	
	if (e == -999) {
		return e;
	}
	
	return (c - src);
}